

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O0

lzham_uint32 lzham::lzham_lib_compress_deinit(lzham_compress_state_ptr p)

{
  long in_RDI;
  uint32 adler32;
  lzham_compress_state *pState;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = 0;
  }
  else {
    local_4 = lzcompressor::get_src_adler32((lzcompressor *)(in_RDI + 0x2c8));
    lzham_delete<lzham::lzham_compress_state>((lzham_compress_state *)0x10f044);
  }
  return local_4;
}

Assistant:

lzham_uint32 lzham_lib_compress_deinit(lzham_compress_state_ptr p)
   {
      lzham_compress_state *pState = static_cast<lzham_compress_state *>(p);
      if (!pState)
         return 0;  

      uint32 adler32 = pState->m_compressor.get_src_adler32();

      lzham_delete(pState);

      return adler32;
   }